

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O2

int __thiscall TPZMeshSolution::ClassId(TPZMeshSolution *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZMeshSolution",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZFunction<double>::ClassId(&this->super_TPZFunction<double>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZMeshSolution::ClassId() const{
    return Hash("TPZMeshSolution") ^ TPZFunction<STATE>::ClassId() << 1;
}